

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DependenceGraph.h
# Opt level: O3

LLVMNode * __thiscall
dg::DependenceGraph<dg::LLVMNode>::_getNode<llvm::Value*>
          (DependenceGraph<dg::LLVMNode> *this,Value *k)

{
  DependenceGraph<dg::LLVMNode> *pDVar1;
  DGParameterPair<dg::LLVMNode> *pDVar2;
  LLVMNode *pLVar3;
  DependenceGraph<dg::LLVMNode> *pDVar4;
  
  pDVar4 = *(DependenceGraph<dg::LLVMNode> **)(this + 0xb8);
  if (pDVar4 != (DependenceGraph<dg::LLVMNode> *)0x0) {
    pDVar1 = this + 0xb0;
    do {
      if (*(Value **)(pDVar4 + 0x20) >= k) {
        pDVar1 = pDVar4;
      }
      pDVar4 = *(DependenceGraph<dg::LLVMNode> **)
                (pDVar4 + (ulong)(*(Value **)(pDVar4 + 0x20) < k) * 8 + 0x10);
    } while (pDVar4 != (DependenceGraph<dg::LLVMNode> *)0x0);
    if ((pDVar1 != this + 0xb0) && (*(Value **)(pDVar1 + 0x20) <= k)) {
      return *(LLVMNode **)(pDVar1 + 0x28);
    }
  }
  if ((*(DGParameters<dg::LLVMNode> **)(this + 0x28) != (DGParameters<dg::LLVMNode> *)0x0) &&
     (pDVar2 = DGParameters<dg::LLVMNode>::find(*(DGParameters<dg::LLVMNode> **)(this + 0x28),k),
     pDVar2 != (DGParameterPair<dg::LLVMNode> *)0x0)) {
    return *(LLVMNode **)pDVar2;
  }
  pLVar3 = _getGlobalNode<llvm::Value*>(this,k);
  return pLVar3;
}

Assistant:

NodeT *_getNode(T k) {
        auto it = nodes.find(k);
        if (it != nodes.end())
            return it->second;

        if (formalParameters) {
            auto p = formalParameters->find(k);
            if (p)
                return p->in;
        }

        return getGlobalNode(k);
    }